

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_load_pem_objects
              (char *pem_fname,char *label,ptls_iovec_t *list,size_t list_max,size_t *nb_objects)

{
  FILE *__stream;
  ptls_buffer_t *in_RCX;
  long in_RDX;
  char *in_RDI;
  ulong *in_R8;
  ptls_buffer_t buf;
  size_t count;
  int ret;
  FILE *F;
  ptls_buffer_t *in_stack_000000c0;
  char *in_stack_000000c8;
  FILE *in_stack_000000d0;
  void *in_stack_ffffffffffffff98;
  ptls_buffer_t *in_stack_ffffffffffffffa0;
  long local_50;
  int local_48;
  ptls_buffer_t *buf_00;
  int local_34;
  
  local_34 = 0;
  buf_00 = (ptls_buffer_t *)0x0;
  __stream = fopen(in_RDI,"r");
  if (__stream == (FILE *)0x0) {
    local_34 = -1;
  }
  *in_R8 = 0;
  if (local_34 == 0) {
    while (buf_00 < in_RCX) {
      ptls_buffer_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x109042);
      local_34 = ptls_get_pem_object(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
      if (local_34 != 0) {
        ptls_buffer_dispose(buf_00);
        break;
      }
      if ((local_50 == 0) || (local_48 == 0)) {
        ptls_buffer_dispose(buf_00);
      }
      else {
        *(ptls_buffer_t **)(in_RDX + (long)buf_00 * 0x10) = in_stack_ffffffffffffffa0;
        *(long *)(in_RDX + (long)buf_00 * 0x10 + 8) = local_50;
        buf_00 = (ptls_buffer_t *)((long)&buf_00->base + 1);
      }
    }
  }
  if ((local_34 == 0x233) && (buf_00 != (ptls_buffer_t *)0x0)) {
    local_34 = 0;
  }
  *in_R8 = (ulong)buf_00;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return local_34;
}

Assistant:

int ptls_load_pem_objects(char const *pem_fname, const char *label, ptls_iovec_t *list, size_t list_max, size_t *nb_objects)
{
    FILE *F;
    int ret = 0;
    size_t count = 0;
#ifdef _WINDOWS
    errno_t err = fopen_s(&F, pem_fname, "r");
    if (err != 0) {
        ret = -1;
    }
#else
    F = fopen(pem_fname, "r");
    if (F == NULL) {
        ret = -1;
    }
#endif

    *nb_objects = 0;

    if (ret == 0) {
        while (count < list_max) {
            ptls_buffer_t buf;

            ptls_buffer_init(&buf, "", 0);

            ret = ptls_get_pem_object(F, label, &buf);

            if (ret == 0) {
                if (buf.off > 0 && buf.is_allocated) {
                    list[count].base = buf.base;
                    list[count].len = buf.off;
                    count++;
                } else {
                    ptls_buffer_dispose(&buf);
                }
            } else {
                ptls_buffer_dispose(&buf);
                break;
            }
        }
    }

    if (ret == PTLS_ERROR_PEM_LABEL_NOT_FOUND && count > 0) {
        ret = 0;
    }

    *nb_objects = count;

    if (F != NULL) {
        fclose(F);
    }

    return ret;
}